

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata_impl.h
# Opt level: O2

void __thiscall
QtPrivate::
QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>_>
::reset(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>_>
        *this,QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
              *t)

{
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                     *)0x0) {
        std::
        _Rb_tree<int,_std::pair<const_int,_QPointer<QAbstractItemDelegate>_>,_std::_Select1st<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>
        ::~_Rb_tree(&(pQVar1->m)._M_t);
      }
      operator_delete(pQVar1,0x38);
    }
  }
  (this->d).ptr = t;
  if (t != (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
            *)0x0) {
    LOCK();
    (t->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (t->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

void reset(T *t = nullptr) noexcept
    {
        if (d && !d->ref.deref())
            delete d.get();
        d.reset(t);
        if (d)
            d->ref.ref();
    }